

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processBinaryWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  pointer pcVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  
  pcVar1 = (word->_M_dataplus)._M_p;
  uVar11 = 0;
  iVar5 = (int)word->_M_string_length;
  uVar3 = 0;
  if (0 < iVar5) {
    uVar3 = word->_M_string_length & 0xffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  for (; uVar7 = (uint)uVar8, uVar3 != uVar11; uVar11 = uVar11 + 1) {
    if (1 < (byte)pcVar1[uVar11] - 0x30) {
      if (pcVar1[uVar11] != 0x2c) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
        poVar2 = std::operator<<(poVar2," at token: ");
        poVar2 = std::operator<<(poVar2,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Invalid character in binary number (character is ");
        poVar2 = std::operator<<(poVar2,(word->_M_dataplus)._M_p[uVar11]);
        pcVar6 = ")";
        goto LAB_00127e2a;
      }
      if (uVar7 != 0xffffffff) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
        poVar2 = std::operator<<(poVar2," at token: ");
        poVar2 = std::operator<<(poVar2,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar2);
        pcVar6 = "extra comma in binary number";
        goto LAB_00127e27;
      }
      uVar8 = uVar11 & 0xffffffff;
    }
  }
  if (uVar7 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "cannot start binary number with a comma";
  }
  else if (uVar7 == iVar5 - 1U) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "cannot end binary number with a comma";
  }
  else if (uVar7 == 0xffffffff) {
    if (iVar5 < 9) {
      bVar10 = 0;
      for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
        bVar10 = bVar10 * '\x02' | pcVar1[uVar11] - 0x30U;
      }
LAB_00127eba:
      std::operator<<(out,bVar10);
      return 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "too many digits in binary number";
  }
  else if ((int)uVar7 < 5) {
    if ((int)(~uVar7 + iVar5) < 5) {
      uVar3 = 0;
      uVar11 = 0;
      if (0 < (int)uVar7) {
        uVar11 = uVar8 & 0xffffffff;
      }
      bVar10 = 0;
      for (; uVar11 != uVar3; uVar3 = uVar3 + 1) {
        bVar10 = bVar10 * '\x02' | pcVar1[uVar3] - 0x30U;
      }
      uVar9 = (uint)bVar10 << (4U - (char)(~uVar7 + iVar5) & 0x1f);
      for (lVar4 = (long)(int)uVar7; bVar10 = (byte)uVar9, lVar4 < iVar5 + -1; lVar4 = lVar4 + 1) {
        uVar9 = uVar9 * 2 & 0xff | (byte)pcVar1[lVar4 + 1] - 0x30;
      }
      goto LAB_00127eba;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "too many digits to right of comma";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "too many digits to left of comma";
  }
LAB_00127e27:
  poVar2 = (ostream *)&std::cerr;
LAB_00127e2a:
  poVar2 = std::operator<<(poVar2,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int Binasc::processBinaryWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int commaIndex = -1;             // index location of comma in number
	int leftDigits = -1;             // number of digits to left of comma
	int rightDigits = -1;            // number of digits to right of comma
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		if (word [i] == ',') {
			if (commaIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "extra comma in binary number" << std::endl;
				return 0;
			} else {
				commaIndex = i;
			}
		} else if (!(word[i] == '1' || word[i] == '0')) {
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "Invalid character in binary number"
					  " (character is " << word[i] <<")" << std::endl;
			return 0;
		}
	}

	// comma cannot start or end number
	if (commaIndex == 0) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot start binary number with a comma" << std::endl;
		return 0;
	} else if (commaIndex == length - 1 ) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot end binary number with a comma" << std::endl;
		return 0;
	}

	// figure out how many digits there are in binary number
	// number must be able to fit into one byte.
	if (commaIndex != -1) {
		leftDigits = commaIndex;
		rightDigits = length - commaIndex - 1;
	} else if (length > 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits in binary number" << std::endl;
		return 0;
	}
	// if there is a comma, then there cannot be more than 4 digits on a side
	if (leftDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to left of comma" << std::endl;
		return 0;
	}
	if (rightDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to right of comma" << std::endl;
		return 0;
	}

	// OK, we have a valid binary number, so calculate the byte

	uchar output = 0;

	// if no comma in binary number
	if (commaIndex == -1) {
		for (i=0; i<length; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}
	// if comma in binary number
	else {
		for (i=0; i<leftDigits; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
		output = output << (4-rightDigits);
		for (i=0+commaIndex+1; i<rightDigits+commaIndex+1; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}

	// send the byte to the output
	out << output;
	return 1;
}